

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O2

void __thiscall
MT32Emu::Partial::startPartial
          (Partial *this,Part *part,Poly *usePoly,PatchCache *usePatchCache,RhythmTemp *rhythmTemp,
          Partial *pairPartial)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  undefined4 uVar8;
  PatchCache *pPVar6;
  TVF *this_00;
  PartialParam *newPartialParam;
  LA32PartialPair *pLVar7;
  bool bVar9;
  bool bVar10;
  Bit32s BVar11;
  uint uVar12;
  Bit32u basePitch;
  PatchTemp *pPVar13;
  Bit8u *pBVar14;
  Tables *pTVar15;
  byte bVar16;
  int iVar17;
  undefined1 *puVar18;
  PCMWaveEntry *pPVar19;
  ulong uVar20;
  Synth *this_01;
  char *pcVar21;
  char *pcVar22;
  LA32PartialPair **ppLVar23;
  
  if (usePoly == (Poly *)0x0 || usePatchCache == (PatchCache *)0x0) {
    pcVar22 = "OK";
    pcVar21 = "OK";
    if (usePoly == (Poly *)0x0) {
      pcVar21 = "*** NULL ***";
    }
    if (usePatchCache == (PatchCache *)0x0) {
      pcVar22 = "*** NULL ***";
    }
    Synth::printDebug(this->synth,
                      "[Partial %d] *** Error: Starting partial for owner %d, usePoly=%s, usePatchCache=%s"
                      ,(ulong)(uint)this->partialIndex,(ulong)(uint)this->ownerPart,pcVar21,pcVar22)
    ;
    return;
  }
  this->patchCache = usePatchCache;
  this->poly = usePoly;
  iVar5 = usePatchCache->structureMix;
  uVar8 = usePatchCache->structurePosition;
  this->mixType = iVar5;
  this->structurePosition = uVar8;
  if (rhythmTemp == (RhythmTemp *)0x0) {
    pPVar13 = Part::getPatchTemp(part);
    pBVar14 = &pPVar13->panpot;
    iVar5 = this->mixType;
  }
  else {
    pBVar14 = &rhythmTemp->panpot;
  }
  bVar3 = *pBVar14;
  if (iVar5 == 3) {
    puVar18 = PAN_NUMERATOR_SLAVE;
    if (this->structurePosition == 0) {
      puVar18 = PAN_NUMERATOR_MASTER;
    }
    cVar4 = puVar18[bVar3];
    this->mixType = 0;
    pairPartial = (Partial *)0x0;
    bVar16 = cVar4 * '\x02';
  }
  else {
    bVar9 = Synth::isNicePanningEnabled(this->synth);
    bVar16 = bVar3 & 0xe;
    if (bVar9) {
      bVar16 = bVar3;
    }
  }
  this_01 = this->synth;
  uVar12 = 0xe - bVar16;
  if (this_01->reversedStereoEnabled == false) {
    uVar12 = (uint)bVar16;
  }
  this->leftPanValue = uVar12;
  this->rightPanValue = 0xe - uVar12;
  if (this->floatMode == false) {
    BVar11 = getPanFactor(uVar12);
    this->leftPanValue = BVar11;
    BVar11 = getPanFactor(this->rightPanValue);
    this->rightPanValue = BVar11;
    this_01 = this->synth;
  }
  bVar9 = Synth::isNicePartialMixingEnabled(this_01);
  if ((!bVar9) && ((this->partialIndex & 4) != 0)) {
    uVar1 = this->leftPanValue;
    uVar2 = this->rightPanValue;
    this->leftPanValue = -uVar1;
    this->rightPanValue = -uVar2;
  }
  pPVar6 = this->patchCache;
  iVar5 = 0;
  if (pPVar6->PCMPartial == true) {
    iVar17 = pPVar6->pcm;
    this->pcmNum = iVar17;
    if ((0x80 < this->synth->controlROMMap->pcmCount) && (1 < pPVar6->waveform)) {
      iVar17 = iVar17 + 0x80;
      this->pcmNum = iVar17;
    }
    pPVar19 = this->synth->pcmWaves + iVar17;
  }
  else {
    pPVar19 = (PCMWaveEntry *)0x0;
  }
  this->pcmWave = pPVar19;
  uVar12 = Poly::getVelocity(this->poly);
  bVar3 = (this->patchCache->srcPartial).wg.pulseWidthVeloSensitivity;
  pTVar15 = Tables::getInstance();
  uVar12 = (uint)pTVar15->pulseWidth100To255[(this->patchCache->srcPartial).wg.pulseWidth] +
           (bVar3 - 7) * (uVar12 - 0x40);
  this->pulseWidthVal = uVar12;
  if (((int)uVar12 < 0) || (iVar5 = 0xff, 0xff < uVar12)) {
    this->pulseWidthVal = iVar5;
  }
  this->pair = pairPartial;
  this->alreadyOutputed = false;
  TVA::reset(this->tva,part,this->patchCache->partialParam,rhythmTemp);
  TVP::reset(this->tvp,part,this->patchCache->partialParam);
  this_00 = this->tvf;
  newPartialParam = this->patchCache->partialParam;
  basePitch = TVP::getBasePitch(this->tvp);
  TVF::reset(this_00,newPartialParam,basePitch);
  bVar9 = isRingModulatingSlave(this);
  if (!bVar9) {
    ppLVar23 = &this->la32Pair;
    pLVar7 = this->la32Pair;
    bVar10 = hasRingModulatingSlave(this);
    (*pLVar7->_vptr_LA32PartialPair[2])(pLVar7,(ulong)bVar10,(ulong)(this->mixType == 1));
  }
  else {
    ppLVar23 = &this->pair->la32Pair;
  }
  uVar20 = (ulong)bVar9;
  pLVar7 = *ppLVar23;
  pPVar19 = this->pcmWave;
  if (pPVar19 == (PCMWaveEntry *)0x0) {
    (*pLVar7->_vptr_LA32PartialPair[3])
              (pLVar7,uVar20,(ulong)(this->patchCache->waveform & 1),
               (ulong)(byte)this->pulseWidthVal,
               (ulong)(byte)((this->patchCache->srcPartial).tvf.resonance + 1));
  }
  else {
    (*pLVar7->_vptr_LA32PartialPair[4])
              (pLVar7,uVar20,this->synth->pcmROMData + pPVar19->addr,(ulong)pPVar19->len,
               (ulong)pPVar19->loop);
  }
  bVar9 = hasRingModulatingSlave(this);
  if (bVar9) {
    return;
  }
  (*this->la32Pair->_vptr_LA32PartialPair[5])(this->la32Pair,1);
  return;
}

Assistant:

void Partial::startPartial(const Part *part, Poly *usePoly, const PatchCache *usePatchCache, const MemParams::RhythmTemp *rhythmTemp, Partial *pairPartial) {
	if (usePoly == NULL || usePatchCache == NULL) {
		synth->printDebug("[Partial %d] *** Error: Starting partial for owner %d, usePoly=%s, usePatchCache=%s", partialIndex, ownerPart, usePoly == NULL ? "*** NULL ***" : "OK", usePatchCache == NULL ? "*** NULL ***" : "OK");
		return;
	}
	patchCache = usePatchCache;
	poly = usePoly;
	mixType = patchCache->structureMix;
	structurePosition = patchCache->structurePosition;

	Bit8u panSetting = rhythmTemp != NULL ? rhythmTemp->panpot : part->getPatchTemp()->panpot;
	if (mixType == 3) {
		if (structurePosition == 0) {
			panSetting = PAN_NUMERATOR_MASTER[panSetting] << 1;
		} else {
			panSetting = PAN_NUMERATOR_SLAVE[panSetting] << 1;
		}
		// Do a normal mix independent of any pair partial.
		mixType = 0;
		pairPartial = NULL;
	} else if (!synth->isNicePanningEnabled()) {
		// Mok wanted an option for smoother panning, and we love Mok.
		// CONFIRMED by Mok: exactly bytes like this (right shifted) are sent to the LA32.
		panSetting &= 0x0E;
	}

	leftPanValue = synth->reversedStereoEnabled ? 14 - panSetting : panSetting;
	rightPanValue = 14 - leftPanValue;

	if (!floatMode) {
		leftPanValue = getPanFactor(leftPanValue);
		rightPanValue = getPanFactor(rightPanValue);
	}

	// SEMI-CONFIRMED: From sample analysis:
	// Found that timbres with 3 or 4 partials (i.e. one using two partial pairs) are mixed in two different ways.
	// Either partial pairs are added or subtracted, it depends on how the partial pairs are allocated.
	// It seems that partials are grouped into quarters and if the partial pairs are allocated in different quarters the subtraction happens.
	// Though, this matters little for the majority of timbres, it becomes crucial for timbres which contain several partials that sound very close.
	// In this case that timbre can sound totally different depending on the way it is mixed up.
	// Most easily this effect can be displayed with the help of a special timbre consisting of several identical square wave partials (3 or 4).
	// Say, it is 3-partial timbre. Just play any two notes simultaneously and the polys very probably are mixed differently.
	// Moreover, the partial allocator retains the last partial assignment it did and all the subsequent notes will sound the same as the last released one.
	// The situation is better with 4-partial timbres since then a whole quarter is assigned for each poly. However, if a 3-partial timbre broke the normal
	// whole-quarter assignment or after some partials got aborted, even 4-partial timbres can be found sounding differently.
	// This behaviour is also confirmed with two more special timbres: one with identical sawtooth partials, and one with PCM wave 02.
	// For my personal taste, this behaviour rather enriches the sounding and should be emulated.
	if (!synth->isNicePartialMixingEnabled() && (partialIndex & 4)) {
		leftPanValue = -leftPanValue;
		rightPanValue = -rightPanValue;
	}

	if (patchCache->PCMPartial) {
		pcmNum = patchCache->pcm;
		if (synth->controlROMMap->pcmCount > 128) {
			// CM-32L, etc. support two "banks" of PCMs, selectable by waveform type parameter.
			if (patchCache->waveform > 1) {
				pcmNum += 128;
			}
		}
		pcmWave = &synth->pcmWaves[pcmNum];
	} else {
		pcmWave = NULL;
	}

	// CONFIRMED: pulseWidthVal calculation is based on information from Mok
	pulseWidthVal = (poly->getVelocity() - 64) * (patchCache->srcPartial.wg.pulseWidthVeloSensitivity - 7) + Tables::getInstance().pulseWidth100To255[patchCache->srcPartial.wg.pulseWidth];
	if (pulseWidthVal < 0) {
		pulseWidthVal = 0;
	} else if (pulseWidthVal > 255) {
		pulseWidthVal = 255;
	}

	pair = pairPartial;
	alreadyOutputed = false;
	tva->reset(part, patchCache->partialParam, rhythmTemp);
	tvp->reset(part, patchCache->partialParam);
	tvf->reset(patchCache->partialParam, tvp->getBasePitch());

	LA32PartialPair::PairType pairType;
	LA32PartialPair *useLA32Pair;
	if (isRingModulatingSlave()) {
		pairType = LA32PartialPair::SLAVE;
		useLA32Pair = pair->la32Pair;
	} else {
		pairType = LA32PartialPair::MASTER;
		la32Pair->init(hasRingModulatingSlave(), mixType == 1);
		useLA32Pair = la32Pair;
	}
	if (isPCM()) {
		useLA32Pair->initPCM(pairType, &synth->pcmROMData[pcmWave->addr], pcmWave->len, pcmWave->loop);
	} else {
		useLA32Pair->initSynth(pairType, (patchCache->waveform & 1) != 0, pulseWidthVal, patchCache->srcPartial.tvf.resonance + 1);
	}
	if (!hasRingModulatingSlave()) {
		la32Pair->deactivate(LA32PartialPair::SLAVE);
	}
}